

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_insertADynArray_success_negativeIndexGetsMaxIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte *array;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  void *_ck_x;
  byte **ppbVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  byte *pbStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  byte *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x5;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x11335e;
  local_20 = (byte *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  local_20[0] = 0x30;
  local_20[1] = 0x31;
  local_20[2] = 0x32;
  local_20[3] = 0x33;
  local_20[4] = 0x34;
  uStack_50 = 0x113378;
  array = (byte *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  array[2] = 0;
  array[0] = 0x35;
  array[1] = 0x36;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x1133ac;
  bVar1 = private_ACUtils_ADynArray_insertArray(&local_48,0xffffffffffffffff,array,3,1);
  if (bVar1 == true) {
    uStack_50 = 0x1133c6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x494);
    if (local_30 == (char *)0x8) {
      uStack_50 = 0x1133e6;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x495);
      if (local_28 == (char *)0x8) {
        uStack_50 = 0x113406;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x496);
        if (local_20 == (byte *)0x0) {
          ppcVar7 = &local_58;
          pcVar5 = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) destArray.buffer != NULL";
          pcVar9 = "(void*) destArray.buffer";
          iVar2 = 0x497;
          goto LAB_00113739;
        }
        uStack_50 = 0x113423;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x497);
        pbStack_80 = local_20;
        if (local_20 == (byte *)0x0) {
          pcVar4 = "";
          pbStack_80 = (byte *)0x1589ce;
        }
        else {
          uStack_50 = 0x113440;
          iVar2 = strcmp("0123456",(char *)local_20);
          if (iVar2 == 0) {
            uStack_50 = 0x113459;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x498);
            if (local_38 == (code *)0x0) {
              ppcVar7 = &local_58;
              pcVar5 = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar8 = "(void*) destArray.growStrategy != NULL";
              pcVar9 = "(void*) destArray.growStrategy";
              iVar2 = 0x499;
LAB_00113739:
              uStack_50 = 0;
              local_58 = (char *)0x0;
              *(code **)((long)ppcVar7 + -8) =
                   test_ADynArray_insertADynArray_failure_bufferExpansionFailed_fn;
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
            }
            uStack_50 = 0x113479;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x499);
            uStack_50 = 0x113486;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x49a);
            uStack_50 = 0x113493;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x49b);
            uStack_50 = 0x1134a0;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x49c);
            uVar3 = *array - 0x35;
            if ((uVar3 == 0) && (uVar3 = array[1] - 0x36, uVar3 == 0)) {
              uVar3 = (uint)array[2];
            }
            if (uVar3 == 0) {
              uStack_50 = 0x1134d3;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x49d);
              uStack_50 = 0x1134e0;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x49e);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                uStack_50 = 0x113501;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x49f);
                uStack_50 = 0x11350a;
                (*pcStack_40)(local_20);
                private_ACUtilsTest_ADynArray_freeCount =
                     private_ACUtilsTest_ADynArray_freeCount + 1;
                uStack_50 = 0x113519;
                free(array);
                return;
              }
              ppcVar7 = &local_68;
              local_60 = "0";
              local_68 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
              pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar9 = "private_ACUtilsTest_ADynArray_reallocCount";
              iVar2 = 0x49f;
              goto LAB_00113739;
            }
            pcVar4 = "\"";
            expr = 
            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
            ;
            pcVar9 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
            pcVar5 = "srcArray.buffer == \"56\"";
            pcVar8 = "srcArray.buffer";
            iVar2 = 0x49d;
            local_58 = "\"";
            local_60 = "56";
            local_68 = "\"";
            pcStack_70 = "\"56\"";
            pcStack_78 = "\"";
            ppbVar6 = &pbStack_80;
            pbStack_80 = array;
            goto LAB_001136ee;
          }
          pcVar4 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar9 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar5 = "destArray.buffer == \"0123456\"";
        pcVar8 = "destArray.buffer";
        iVar2 = 0x498;
        local_58 = "\"";
        local_60 = "0123456";
        local_68 = "\"";
        pcStack_70 = "\"0123456\"";
        ppbVar6 = &pbStack_80;
        pcStack_78 = pcVar4;
        goto LAB_001136ee;
      }
      pcVar5 = "destArray.capacity == 8";
      pcVar8 = "destArray.capacity";
      iVar2 = 0x496;
      pcVar4 = local_28;
    }
    else {
      pcVar5 = "destArray.size == 8";
      pcVar8 = "destArray.size";
      iVar2 = 0x495;
      pcVar4 = local_30;
    }
    local_60 = "8";
    local_58 = (char *)0x8;
  }
  else {
    pcVar4 = (char *)(ulong)bVar1;
    local_60 = "true";
    pcVar5 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, -1, (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer))) == true"
    ;
    pcVar8 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, -1, (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer)))"
    ;
    iVar2 = 0x494;
    local_58 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar9 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppbVar6 = (byte **)&local_60;
LAB_001136ee:
  uStack_50 = 0;
  *(char **)((long)ppbVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppbVar6 + -0x10) = 0x1136f5;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar9,pcVar5,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insertADynArray_success_negativeIndexGetsMaxIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray destArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    destArray.size = 5;
    destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    destArray.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    destArray.buffer = (char*) destArray.reallocator(nullptr, destArray.capacity);
    memcpy(destArray.buffer, "01234", 5);
    srcArray.size = 3;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    memcpy(srcArray.buffer, "56", 3);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertADynArray(&destArray, -1, &srcArray), true);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(destArray.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(srcArray.buffer, "56");
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    destArray.deallocator(destArray.buffer);
    srcArray.deallocator(srcArray.buffer);
}